

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::SeparatorEx(ImGuiSeparatorFlags flags)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImDrawList *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  ImU32 IVar7;
  ImGuiColumns *pIVar8;
  ImRect bb;
  ImVec2 local_58;
  float local_50;
  float local_4c;
  ImRect local_48;
  ImVec2 local_38;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    uVar1 = (flags & 3U) - 1;
    if ((flags & 3U ^ uVar1) <= uVar1) {
      __assert_fail("ImIsPowerOfTwo(flags & (ImGuiSeparatorFlags_Horizontal | ImGuiSeparatorFlags_Vertical))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                    ,0x4d1,"void ImGui::SeparatorEx(ImGuiSeparatorFlags)");
    }
    if ((flags & 2U) == 0) {
      if ((flags & 1U) != 0) {
        local_48.Max.x = (pIVar2->Pos).x;
        local_48.Min.x = local_48.Max.x;
        if ((pIVar2->DC).GroupStack.Size != 0) {
          local_48.Min.x = (pIVar2->DC).Indent.x + local_48.Max.x;
        }
        local_48.Max.x = local_48.Max.x + (pIVar2->Size).x;
        bVar5 = true;
        if (((flags & 4U) == 0) ||
           (pIVar8 = (pIVar2->DC).CurrentColumns, pIVar8 == (ImGuiColumns *)0x0)) {
          pIVar8 = (ImGuiColumns *)0x0;
        }
        else {
          local_50 = local_48.Min.x;
          local_4c = local_48.Max.x;
          PushColumnsBackground();
          bVar5 = false;
          local_48.Max.x = local_4c;
          local_48.Min.x = local_50;
        }
        local_48.Min.y = (pIVar2->DC).CursorPos.y;
        local_48.Max.y = local_48.Min.y + 1.0;
        local_58.x = 0.0;
        local_58.y = 0.0;
        ItemSize(&local_58,-1.0);
        bVar6 = ItemAdd(&local_48,0,(ImRect *)0x0);
        if (bVar6) {
          pIVar3 = pIVar2->DrawList;
          local_58.y = local_48.Min.y;
          local_58.x = local_48.Max.x;
          IVar7 = GetColorU32(0x1b,1.0);
          ImDrawList::AddLine(pIVar3,&local_48.Min,&local_58,IVar7,1.0);
          if (pIVar4->LogEnabled == true) {
            LogRenderedText(&local_48.Min,"--------------------------------",(char *)0x0);
          }
        }
        if (!bVar5) {
          PopColumnsBackground();
          pIVar8->LineMinY = (pIVar2->DC).CursorPos.y;
        }
      }
    }
    else {
      local_48.Min.x = (pIVar2->DC).CursorPos.x;
      local_48.Min.y = (pIVar2->DC).CursorPos.y;
      local_48.Max.x = local_48.Min.x + 1.0;
      local_48.Max.y = (pIVar2->DC).CurrLineSize.y + local_48.Min.y;
      local_58.x = 0.0;
      local_58.y = 0.0;
      ItemSize(&local_58,-1.0);
      bVar5 = ItemAdd(&local_48,0,(ImRect *)0x0);
      if (bVar5) {
        pIVar3 = pIVar2->DrawList;
        local_58.y = local_48.Min.y;
        local_58.x = local_48.Min.x;
        local_38.x = local_48.Min.x;
        local_38.y = local_48.Max.y;
        IVar7 = GetColorU32(0x1b,1.0);
        ImDrawList::AddLine(pIVar3,&local_58,&local_38,IVar7,1.0);
        if (pIVar4->LogEnabled == true) {
          LogText(" |");
        }
      }
    }
  }
  return;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}